

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Write<int> __thiscall
Omega_h::divide_each<int>(Omega_h *this,Read<int> *a,Read<int> *b,string *name)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar1;
  Write<int> WVar2;
  undefined1 local_e8 [8];
  type f;
  int width;
  string *name_local;
  Read<int> *b_local;
  Read<int> *a_local;
  Write<int> *c;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  f.b.write_.shared_alloc_.direct_ptr._4_4_ =
       divide_no_remainder<int>((int)(local_10 >> 2),(int)(local_20 >> 2));
  f.b.write_.shared_alloc_.direct_ptr._3_1_ = 0;
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  Write<int>::Write((Write<int> *)this,(LO)(local_30 >> 2),name);
  local_e8._0_4_ = f.b.write_.shared_alloc_.direct_ptr._4_4_;
  Write<int>::Write((Write<int> *)&f,(Write<int> *)this);
  Read<int>::Read((Read<int> *)&f.c.shared_alloc_.direct_ptr,a);
  Read<int>::Read((Read<int> *)&f.a.write_.shared_alloc_.direct_ptr,b);
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_40 = ((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_40 = (ulong)(b->write_).shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::divide_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
            ((LO)(local_40 >> 2),(type *)local_e8,"divide_each");
  f.b.write_.shared_alloc_.direct_ptr._3_1_ = 1;
  divide_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::
  {lambda(int)#1}::~basic_string((_lambda_int__1_ *)local_e8);
  pvVar1 = extraout_RDX;
  if ((f.b.write_.shared_alloc_.direct_ptr._3_1_ & 1) == 0) {
    Write<int>::~Write((Write<int> *)this);
    pvVar1 = extraout_RDX_00;
  }
  WVar2.shared_alloc_.direct_ptr = pvVar1;
  WVar2.shared_alloc_.alloc = (Alloc *)this;
  return (Write<int>)WVar2.shared_alloc_;
}

Assistant:

Write<T> divide_each(Read<T> a, Read<T> b, std::string const& name) {
  auto width = divide_no_remainder(a.size(), b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) {
    for (Int j = 0; j < width; ++j) {
      c[i * width + j] = a[i * width + j] / b[i];
    }
  };
  parallel_for(b.size(), f, "divide_each");
  return c;
}